

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

bool __thiscall QResourceFileEnginePrivate::mapUncompressed_sys(QResourceFileEnginePrivate *this)

{
  QResourcePrivate *pQVar1;
  uchar *puVar2;
  QResourceRoot *pQVar3;
  QArrayData *data;
  int iVar4;
  int iVar5;
  qint64 qVar6;
  void *pvVar7;
  long lVar8;
  size_t __old_len;
  
  pQVar1 = (this->resource).d_ptr.d;
  QResourcePrivate::ensureInitialized(pQVar1);
  puVar2 = pQVar1->data;
  pQVar1 = (this->resource).d_ptr.d;
  QResourcePrivate::ensureInitialized(pQVar1);
  qVar6 = QResourcePrivate::uncompressedSize(pQVar1);
  iVar4 = getpagesize();
  pQVar3 = *(((this->resource).d_ptr.d)->related).d.ptr;
  iVar5 = (*pQVar3->_vptr_QResourceRoot[3])(pQVar3);
  if ((iVar5 == 0) || ((iVar5 != 2 && (pQVar3[2].names != (uchar *)0x0)))) {
    lVar8 = (long)iVar4;
    pvVar7 = (void *)(-lVar8 & (ulong)puVar2);
    __old_len = ((ulong)(puVar2 + lVar8 + qVar6 + -1) & -lVar8) - (long)pvVar7;
    pvVar7 = mremap(pvVar7,__old_len,__old_len,5);
    if (pvVar7 == (void *)0xffffffffffffffff) {
      return false;
    }
    iVar4 = mprotect(pvVar7,__old_len,3);
    if (iVar4 == 0) {
      if (pvVar7 != (void *)0x0) {
        pQVar1 = (this->resource).d_ptr.d;
        QResourcePrivate::ensureInitialized(pQVar1);
        qVar6 = QResourcePrivate::uncompressedSize(pQVar1);
        data = &((this->uncompressed).d.d)->super_QArrayData;
        (this->uncompressed).d.d = (Data *)0x0;
        (this->uncompressed).d.ptr = (char *)((long)pvVar7 + (lVar8 - 1U & (ulong)puVar2));
        (this->uncompressed).d.size = qVar6;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,1,0x10);
          }
        }
        this->mustUnmap = true;
        return true;
      }
    }
    else {
      munmap(pvVar7,__old_len);
    }
  }
  return false;
}

Assistant:

bool QResourceFileEnginePrivate::mapUncompressed_sys()
{
    auto r = mappingBoundaries(resource.data(), resource.uncompressedSize());
    void *ptr = nullptr;

#if defined(MREMAP_MAYMOVE) && defined(MREMAP_DONTUNMAP)
    // Use MREMAP_MAYMOVE to tell the kernel to give us a new address and use
    // MREMAP_DONTUNMAP (supported since kernel 5.7) to request that it create
    // a new mapping of the same pages, instead of moving. We can only do that
    // for pages that are read-only, otherwise the kernel replaces the source
    // with pages full of nulls.
    if (!QResourcePrivate::mayRemapData(resource))
        return false;

    ptr = mremap(r.begin, r.size, r.size, MREMAP_MAYMOVE | MREMAP_DONTUNMAP);
    if (ptr == MAP_FAILED)
        return false;

    // Allow writing, which the documentation says we allow. This is safe
    // because MREMAP_DONTUNMAP only works for private mappings.
    if (mprotect(ptr, r.size, PROT_READ | PROT_WRITE) != 0) {
        munmap(ptr, r.size);
        return false;
    }
#elif defined(Q_OS_DARWIN)
    mach_port_t self = mach_task_self();
    vm_address_t addr = 0;
    vm_address_t mask = 0;
    bool anywhere = true;
    bool copy = true;
    vm_prot_t cur_prot = VM_PROT_READ | VM_PROT_WRITE;
    vm_prot_t max_prot = VM_PROT_ALL;
    kern_return_t res = vm_remap(self, &addr, r.size, mask, anywhere,
                                 self, vm_address_t(r.begin), copy, &cur_prot,
                                 &max_prot, VM_INHERIT_DEFAULT);
    if (res != KERN_SUCCESS)
        return false;

    ptr = reinterpret_cast<void *>(addr);
    if ((max_prot & VM_PROT_WRITE) == 0 || mprotect(ptr, r.size, PROT_READ | PROT_WRITE) != 0) {
        munmap(ptr, r.size);
        return false;
    }
#endif

    if (!ptr)
        return false;
    const char *newdata = static_cast<char *>(ptr) + r.offset;
    uncompressed = QByteArray::fromRawData(newdata, resource.uncompressedSize());
    mustUnmap = true;
    return true;
}